

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O1

void json_error(int err)

{
  char *pcVar1;
  
  if (err + 3U < 4) {
    pcVar1 = &DAT_00110428 + *(int *)(&DAT_00110428 + (ulong)(err + 3U) * 4);
  }
  else {
    pcVar1 = "Unknown error";
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
          ,0xb9,"JSON parsing failed: %s\n",pcVar1);
  return;
}

Assistant:

void
json_error(int err)
{
    const char *errstr;
    switch (err) {
    case JSMN_ERROR_INVAL:
        errstr = "JSMN_ERROR_INVAL - bad token, JSON string is corrupted";
        break;
    case JSMN_ERROR_NOMEM:
        errstr = "JSMN_ERROR_NOMEM - not enough tokens, JSON string is too large";
        break;
    case JSMN_ERROR_PART:
        errstr = "JSMN_ERROR_PART - JSON string is too short, expecting more JSON data";
        break;
    case 0:
        errstr = "JSON string appears to be empty";
        break;
    default:
        errstr = "Unknown error";
    }
    E_ERROR("JSON parsing failed: %s\n", errstr);
}